

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_timing.cpp
# Opt level: O0

void Am_Reset_Timer_Start(Am_Object *obj,Am_Slot_Key slot)

{
  bool bVar1;
  Am_Value *this;
  ostream *poVar2;
  Am_Time local_28;
  Am_Object *local_20;
  Am_Interactor_Time_Event *e;
  Am_Object *pAStack_10;
  Am_Slot_Key slot_local;
  Am_Object *obj_local;
  
  e._6_2_ = slot;
  pAStack_10 = obj;
  Am_Value_List::Start(&am_timing_events);
  while( true ) {
    bVar1 = Am_Value_List::Last(&am_timing_events);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar2 = std::operator<<(poVar2,"Am_Reset_Timer_Start on ");
      poVar2 = operator<<(poVar2,obj);
      poVar2 = std::operator<<(poVar2," slot ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,e._6_2_);
      poVar2 = std::operator<<(poVar2," but hasn\'t been registered");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      Am_Error();
    }
    this = Am_Value_List::Get(&am_timing_events);
    local_20 = (Am_Object *)Am_Value::operator_cast_to_void_(this);
    bVar1 = Am_Object::operator==(local_20,obj);
    if ((bVar1) && (*(Am_Slot_Key *)&local_20[1].data == e._6_2_)) break;
    Am_Value_List::Next(&am_timing_events);
  }
  am_clock();
  Am_Time::operator=((Am_Time *)(local_20 + 4),&local_28);
  Am_Time::~Am_Time(&local_28);
  return;
}

Assistant:

void
Am_Reset_Timer_Start(Am_Object obj, Am_Slot_Key slot)
{
  Am_Interactor_Time_Event *e;
  for (am_timing_events.Start(); !am_timing_events.Last();
       am_timing_events.Next()) {
    e = (Am_Interactor_Time_Event *)(Am_Ptr)am_timing_events.Get();
    if (e->object == obj && e->method_slot == slot) {
      e->start_time = am_clock();
      return;
    }
  }
  Am_ERROR("Am_Reset_Timer_Start on " << obj << " slot " << slot
                                      << " but hasn't been registered")
}